

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  undefined8 uVar1;
  tinfl_status tVar2;
  int iVar3;
  void *pvVar4;
  undefined8 in_RCX;
  code *in_RDX;
  undefined8 *in_RSI;
  tinfl_status status;
  size_t dst_buf_size;
  size_t in_buf_size;
  size_t dict_ofs;
  size_t in_buf_ofs;
  mz_uint8 *pDict;
  tinfl_decompressor decomp;
  int result;
  size_t *in_stack_ffffffffffffd700;
  mz_uint8 *in_stack_ffffffffffffd708;
  mz_uint8 *in_stack_ffffffffffffd710;
  size_t *in_stack_ffffffffffffd718;
  mz_uint8 *in_stack_ffffffffffffd720;
  tinfl_decompressor *in_stack_ffffffffffffd728;
  mz_uint32 in_stack_ffffffffffffd740;
  uint local_30;
  uint local_4;
  
  local_30 = 0;
  pvVar4 = crnlib::crnlib_malloc(0x158444);
  if (pvVar4 == (void *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    do {
      uVar1 = *in_RSI;
      tVar2 = tinfl_decompress(in_stack_ffffffffffffd728,in_stack_ffffffffffffd720,
                               in_stack_ffffffffffffd718,in_stack_ffffffffffffd710,
                               in_stack_ffffffffffffd708,in_stack_ffffffffffffd700,
                               in_stack_ffffffffffffd740);
      iVar3 = (*in_RDX)(pvVar4,0x8000,in_RCX);
      if (iVar3 == 0) goto LAB_0015855c;
    } while (tVar2 == TINFL_STATUS_HAS_MORE_OUTPUT);
    local_30 = (uint)(tVar2 == TINFL_STATUS_DONE);
LAB_0015855c:
    crnlib::crnlib_free((void *)0x158566);
    *in_RSI = uVar1;
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void* pIn_buf, size_t* pIn_buf_size, tinfl_put_buf_func_ptr pPut_buf_func, void* pPut_buf_user, int flags) {
  int result = 0;
  tinfl_decompressor decomp;
  mz_uint8* pDict = (mz_uint8*)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
  size_t in_buf_ofs = 0, dict_ofs = 0;
  if (!pDict)
    return TINFL_STATUS_FAILED;
  tinfl_init(&decomp);
  for (;;) {
    size_t in_buf_size = *pIn_buf_size - in_buf_ofs, dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
    tinfl_status status = tinfl_decompress(&decomp, (const mz_uint8*)pIn_buf + in_buf_ofs, &in_buf_size, pDict, pDict + dict_ofs, &dst_buf_size,
                                           (flags & ~(TINFL_FLAG_HAS_MORE_INPUT | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
    in_buf_ofs += in_buf_size;
    if ((dst_buf_size) && (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
      break;
    if (status != TINFL_STATUS_HAS_MORE_OUTPUT) {
      result = (status == TINFL_STATUS_DONE);
      break;
    }
    dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
  }
  MZ_FREE(pDict);
  *pIn_buf_size = in_buf_ofs;
  return result;
}